

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::logError(CLIntercept *this,char *functionName,cl_int errorCode)

{
  ostream *poVar1;
  double __x;
  ostringstream ss;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"ERROR! ");
  poVar1 = std::operator<<(poVar1,functionName);
  poVar1 = std::operator<<(poVar1," returned ");
  CEnumNameMap::name_abi_cxx11_(&sStack_1b8,&this->m_EnumNameMap,errorCode);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_1b8);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,errorCode);
  std::operator<<(poVar1,")\n");
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::mutex::lock(&this->m_Mutex);
  __x = (double)std::__cxx11::stringbuf::str();
  log(this,__x);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void CLIntercept::logError(
    const char* functionName,
    cl_int errorCode )
{
    std::ostringstream  ss;
    ss << "ERROR! " << functionName << " returned " << enumName().name(errorCode) << " (" << errorCode << ")\n";

    std::lock_guard<std::mutex> lock(m_Mutex);
    log( ss.str() );
}